

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetype.cpp
# Opt level: O2

QStringList * __thiscall QMimeType::suffixes(QStringList *__return_storage_ptr__,QMimeType *this)

{
  bool bVar1;
  qsizetype qVar2;
  long lVar3;
  QString *this_00;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  globPatterns((QStringList *)&local_58,this);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve(__return_storage_ptr__,local_58.size);
  this_00 = local_58.ptr;
  for (lVar3 = local_58.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    s.m_data = "*.";
    s.m_size = 2;
    bVar1 = QString::startsWith(this_00,s,CaseSensitive);
    if ((bVar1) && (2 < (ulong)(this_00->d).size)) {
      qVar2 = QString::indexOf(this_00,(QChar)0x2a,2,CaseSensitive);
      if (qVar2 < 0) {
        qVar2 = QString::indexOf(this_00,(QChar)0x3f,2,CaseSensitive);
        if (qVar2 < 0) {
          local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QString::mid((QString *)&local_78,this_00,2,-1);
          QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        }
      }
    }
    this_00 = this_00 + 1;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeType::suffixes() const
{
    const QStringList patterns = globPatterns();

    QStringList result;
    result.reserve(patterns.size());
    for (const QString &pattern : patterns) {
        // Not a simple suffix if it looks like: README or *. or *.* or *.JP*G or *.JP?
        if (pattern.startsWith("*."_L1) &&
            pattern.size() > 2 &&
            pattern.indexOf(u'*', 2) < 0 && pattern.indexOf(u'?', 2) < 0) {
            const QString suffix = pattern.mid(2);
            result.append(suffix);
        }
    }

    return result;
}